

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::~Iterator(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
            *this)

{
  reset(this);
  Lib::Stack<Lib::BacktrackData>::~Stack(&this->_bdStack);
  Lib::Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>::
  ~Stack(&this->_nodeIterators);
  Lib::OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::~OptionBase
            (&(this->_leafData).super_OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>);
  Lib::Stack<unsigned_int>::~Stack(&this->_svStack);
  Kernel::RobSubstitution::~RobSubstitution((RobSubstitution *)this);
  return;
}

Assistant:

~Iterator()
      { reset(); }